

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::QPDFWriter(QPDFWriter *this,QPDF *pdf,char *filename)

{
  Members *this_00;
  
  this_00 = (Members *)operator_new(0x430);
  Members::Members(this_00,pdf);
  (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QPDFWriter::Members*>
            (&(this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  setOutputFilename(this,filename);
  return;
}

Assistant:

QPDFWriter::QPDFWriter(QPDF& pdf, char const* filename) :
    m(new Members(pdf))
{
    setOutputFilename(filename);
}